

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String * __thiscall Bstrlib::String::operator=(String *this,String *b)

{
  String *b_local;
  String *this_local;
  
  if (b != this) {
    if ((this->super_tagbstring).mlen < 1) {
      fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
              "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
              ,0x120,"Write protection error");
    }
    if ((this->super_tagbstring).mlen <= (b->super_tagbstring).slen) {
      Alloc(this,(b->super_tagbstring).slen);
    }
    (this->super_tagbstring).slen = (b->super_tagbstring).slen;
    if ((this->super_tagbstring).data == (uchar *)0x0) {
      (this->super_tagbstring).slen = 0;
      (this->super_tagbstring).mlen = 0;
      fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
              "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
              ,0x127,"Failure in =(String) operator");
    }
    else {
      memcpy((this->super_tagbstring).data,(b->super_tagbstring).data,
             (long)(this->super_tagbstring).slen);
      (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
    }
  }
  return this;
}

Assistant:

const String& String::operator=(const String& b)
    {
        if (&b == this)     return *this;
        if (mlen <= 0)        bstringThrow("Write protection error");
        if (b.slen >= mlen)    Alloc(b.slen);

        slen = b.slen;
        if (!data)
        {
            mlen = slen = 0;
            bstringThrow("Failure in =(String) operator");
        }
        else
        {
            memcpy(data, b.data, slen);
            data[slen] = '\0';
        }
        return *this;
    }